

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal_suite.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  
  test_null();
  test_boolean();
  test_integer();
  test_real();
  test_string();
  test_wstring();
  test_u16string();
  test_u32string();
  test_array_null();
  test_array_boolean();
  test_array_integer();
  test_array_real();
  test_array_string();
  test_array_wstring();
  test_array_u16string();
  test_array_u32string();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    test_null();
    test_boolean();
    test_integer();
    test_real();
    test_string();
    test_wstring();
    test_u16string();
    test_u32string();

    test_array_null();
    test_array_boolean();
    test_array_integer();
    test_array_real();
    test_array_string();
    test_array_wstring();
    test_array_u16string();
    test_array_u32string();

    return boost::report_errors();
}